

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsyntaxhighlighter.cpp
# Opt level: O0

void __thiscall
QSyntaxHighlighterPrivate::reformatBlock(QSyntaxHighlighterPrivate *this,QTextBlock *block)

{
  long lVar1;
  QSyntaxHighlighter *t;
  QTextBlock *in_RSI;
  QSyntaxHighlighterPrivate *in_RDI;
  long in_FS_OFFSET;
  QSyntaxHighlighter *q;
  QTextBlock *in_stack_ffffffffffffff68;
  QTextBlock *this_00;
  undefined1 local_40 [16];
  QSyntaxHighlighterPrivate *in_stack_ffffffffffffffd0;
  QTextDocumentPrivate *in_stack_ffffffffffffffd8;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  t = q_func(in_RDI);
  this_00 = &in_RDI->currentBlock;
  QTextBlock::operator=(this_00,in_RSI);
  QTextCharFormat::QTextCharFormat((QTextCharFormat *)0x79aaa7);
  QTextBlock::length(in_stack_ffffffffffffff68);
  QList<QTextCharFormat>::fill
            ((QList<QTextCharFormat> *)in_RSI,(parameter_type)t,(qsizetype)in_stack_ffffffffffffffd8
            );
  QTextCharFormat::~QTextCharFormat((QTextCharFormat *)0x79aacf);
  QTextBlock::text(this_00);
  (**(code **)(*(long *)t + 0x60))(t,local_40);
  QString::~QString((QString *)0x79ab0a);
  applyFormatChanges(in_stack_ffffffffffffffd0);
  QTextBlock::QTextBlock((QTextBlock *)&stack0xffffffffffffffd8);
  QTextBlock::operator=(this_00,(QTextBlock *)&stack0xffffffffffffffd8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QSyntaxHighlighterPrivate::reformatBlock(const QTextBlock &block)
{
    Q_Q(QSyntaxHighlighter);

    Q_ASSERT_X(!currentBlock.isValid(), "QSyntaxHighlighter::reformatBlock()", "reFormatBlock() called recursively");

    currentBlock = block;

    formatChanges.fill(QTextCharFormat(), block.length() - 1);
    q->highlightBlock(block.text());
    applyFormatChanges();

    currentBlock = QTextBlock();
}